

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O1

pcp_server_t * get_pcp_server(pcp_ctx_t *ctx,int pcp_server_index)

{
  pcp_server_t *ppVar1;
  ulong uVar2;
  pcp_server_t *ppVar3;
  
  if (ctx == (pcp_ctx_t *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/libpcp[P]pcp/lib/src/pcp_client_db.c"
                  ,0x157,"pcp_server_t *get_pcp_server(pcp_ctx_t *, int)");
  }
  uVar2 = (ulong)(uint)pcp_server_index;
  if ((pcp_server_index < 0) || ((ctx->pcp_db).pcp_servers_length <= uVar2)) {
    pcp_logger(PCP_LOGLVL_WARN,"server index(%d) out of bounds(%zu)",uVar2,
               (ctx->pcp_db).pcp_servers_length);
    ppVar3 = (pcp_server_t *)0x0;
  }
  else {
    ppVar1 = (ctx->pcp_db).pcp_servers;
    ppVar3 = (pcp_server_t *)0x0;
    if (ppVar1[uVar2].server_state != pss_unitialized) {
      ppVar3 = ppVar1 + uVar2;
    }
  }
  return ppVar3;
}

Assistant:

pcp_server_t *get_pcp_server(pcp_ctx_t *ctx, int pcp_server_index) {
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    assert(ctx);

    if ((pcp_server_index < 0) ||
        ((unsigned)pcp_server_index >= ctx->pcp_db.pcp_servers_length)) {

        PCP_LOG(PCP_LOGLVL_WARN, "server index(%d) out of bounds(%zu)",
                pcp_server_index, ctx->pcp_db.pcp_servers_length);
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }

    if (ctx->pcp_db.pcp_servers[pcp_server_index].server_state ==
        pss_unitialized) {

        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return NULL;
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return ctx->pcp_db.pcp_servers + pcp_server_index;
}